

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::base::internal::OptionalBase<perfetto::LockedHandle<perfetto::ConsoleInterceptor>>::
MoveAssign<perfetto::LockedHandle<perfetto::ConsoleInterceptor>>
          (OptionalBase<perfetto::LockedHandle<perfetto::ConsoleInterceptor>> *this,
          OptionalBase<perfetto::LockedHandle<perfetto::ConsoleInterceptor>_> *other)

{
  OptionalBase<perfetto::LockedHandle<perfetto::ConsoleInterceptor>_> *other_local;
  OptionalBase<perfetto::LockedHandle<perfetto::ConsoleInterceptor>_> *this_local;
  
  if (((other->storage_).
       super_OptionalStorageBase<perfetto::LockedHandle<perfetto::ConsoleInterceptor>,_false>.
       is_populated_ & 1U) == 0) {
    OptionalBase<perfetto::LockedHandle<perfetto::ConsoleInterceptor>_>::FreeIfNeeded
              ((OptionalBase<perfetto::LockedHandle<perfetto::ConsoleInterceptor>_> *)this);
  }
  else {
    InitOrAssign<perfetto::LockedHandle<perfetto::ConsoleInterceptor>>
              (this,&(other->storage_).
                     super_OptionalStorageBase<perfetto::LockedHandle<perfetto::ConsoleInterceptor>,_false>
                     .field_1.value_);
  }
  return;
}

Assistant:

void MoveAssign(OptionalBase<U>&& other) {
    if (other.storage_.is_populated_)
      InitOrAssign(std::move(other.storage_.value_));
    else
      FreeIfNeeded();
  }